

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O3

Optional<llvm::RelocAddrEntry> * __thiscall
anon_unknown.dwarf_31fab1a::DWARFObjInMemory::find
          (Optional<llvm::RelocAddrEntry> *__return_storage_ptr__,DWARFObjInMemory *this,
          DWARFSection *S,uint64_t Pos)

{
  bool bVar1;
  long lVar2;
  RelocAddrEntry *pRVar3;
  Optional<llvm::RelocAddrEntry> *pOVar4;
  byte bVar5;
  const_iterator cVar6;
  uint64_t local_20;
  uint64_t Pos_local;
  
  bVar5 = 0;
  local_20 = Pos;
  cVar6 = llvm::
          DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>_>,_unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>_>
          ::find((DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>_>,_unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>_>
                  *)(S + 1),&local_20);
  if (cVar6.Ptr == (pointer)(S[1].Data.Data + (ulong)*(uint *)&S[2].Data.Data * 0x50)) {
    (__return_storage_ptr__->Storage).field_0.empty = '\0';
    bVar1 = false;
  }
  else {
    pRVar3 = &((cVar6.Ptr)->super_pair<unsigned_long,_llvm::RelocAddrEntry>).second;
    pOVar4 = __return_storage_ptr__;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      (pOVar4->Storage).field_0.value.SectionIndex = pRVar3->SectionIndex;
      pRVar3 = (RelocAddrEntry *)((long)pRVar3 + (ulong)bVar5 * -0x10 + 8);
      pOVar4 = (Optional<llvm::RelocAddrEntry> *)((long)pOVar4 + (ulong)bVar5 * -0x10 + 8);
    }
    bVar1 = true;
  }
  (__return_storage_ptr__->Storage).hasVal = bVar1;
  return __return_storage_ptr__;
}

Assistant:

Optional<RelocAddrEntry> find(const DWARFSection &S,
                                uint64_t Pos) const override {
    auto &Sec = static_cast<const DWARFSectionMap &>(S);
    RelocAddrMap::const_iterator AI = Sec.Relocs.find(Pos);
    if (AI == Sec.Relocs.end())
      return None;
    return AI->second;
  }